

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

LocalTime * Time::LocalTime::Now(void)

{
  LocalTime *in_RDI;
  Time ret;
  timeval local_20;
  
  local_20.tv_sec = 0;
  local_20.tv_usec = 0;
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  (in_RDI->super_Time).timeSinceEpoch.tv_sec = local_20.tv_sec;
  (in_RDI->super_Time).timeSinceEpoch.tv_usec = local_20.tv_usec & 0xffffffff;
  (in_RDI->super_Time)._vptr_Time = (_func_int **)&PTR_getAsDate_0011fce0;
  return in_RDI;
}

Assistant:

LocalTime LocalTime::Now()
    {
        return toLocal(Time::Now());
    }